

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixed_size_allocator.cpp
# Opt level: O2

void __thiscall
duckdb::FixedSizeAllocator::Merge(FixedSizeAllocator *this,FixedSizeAllocator *other)

{
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  *this_00;
  idx_t *piVar1;
  FixedSizeAllocator *this_01;
  idx_t iVar2;
  __node_base *p_Var3;
  __node_base *p_Var4;
  value_type local_50;
  unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>_> local_48;
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_40;
  FixedSizeAllocator *local_38;
  
  iVar2 = GetUpperBoundBufferId(this);
  local_40 = &(other->buffers)._M_h;
  p_Var3 = &(other->buffers)._M_h._M_before_begin;
  local_38 = this;
  while (p_Var3 = p_Var3->_M_nxt, p_Var3 != (__node_base *)0x0) {
    local_50 = (long)&(p_Var3[1]._M_nxt)->_M_nxt + iVar2;
    local_48._M_t.
    super___uniq_ptr_impl<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::FixedSizeBuffer_*,_std::default_delete<duckdb::FixedSizeBuffer>_>
    .super__Head_base<0UL,_duckdb::FixedSizeBuffer_*,_false>._M_head_impl =
         *(__uniq_ptr_data<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true,_true>
           *)&((_Prime_rehash_policy *)(p_Var3 + 2))->_M_max_load_factor;
    *(_Hash_node_base **)&((_Prime_rehash_policy *)(p_Var3 + 2))->_M_max_load_factor =
         (_Hash_node_base *)0x0;
    ::std::
    _Hashtable<unsigned_long,std::pair<unsigned_long_const,duckdb::unique_ptr<duckdb::FixedSizeBuffer,std::default_delete<duckdb::FixedSizeBuffer>,true>>,std::allocator<std::pair<unsigned_long_const,duckdb::unique_ptr<duckdb::FixedSizeBuffer,std::default_delete<duckdb::FixedSizeBuffer>,true>>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::
    _M_emplace<std::pair<unsigned_long,duckdb::unique_ptr<duckdb::FixedSizeBuffer,std::default_delete<duckdb::FixedSizeBuffer>,true>>>
              ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,duckdb::unique_ptr<duckdb::FixedSizeBuffer,std::default_delete<duckdb::FixedSizeBuffer>,true>>,std::allocator<std::pair<unsigned_long_const,duckdb::unique_ptr<duckdb::FixedSizeBuffer,std::default_delete<duckdb::FixedSizeBuffer>,true>>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)&this->buffers,&local_50);
    ::std::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>_>::
    ~unique_ptr(&local_48);
  }
  ::std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::clear(local_40);
  this_01 = local_38;
  p_Var4 = &(other->buffers_with_free_space)._M_h._M_before_begin;
  this_00 = &local_38->buffers_with_free_space;
  while (p_Var4 = p_Var4->_M_nxt, p_Var4 != (__node_base *)0x0) {
    local_50 = (long)&(p_Var4[1]._M_nxt)->_M_nxt + iVar2;
    ::std::__detail::
    _Insert<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
    ::insert((_Insert<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
              *)this_00,&local_50);
  }
  ::std::
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::clear(&(other->buffers_with_free_space)._M_h);
  NextBufferWithFreeSpace(this_01);
  piVar1 = &this_01->total_segment_count;
  *piVar1 = *piVar1 + other->total_segment_count;
  return;
}

Assistant:

void FixedSizeAllocator::Merge(FixedSizeAllocator &other) {
	D_ASSERT(segment_size == other.segment_size);

	// remember the buffer count and merge the buffers
	idx_t upper_bound_id = GetUpperBoundBufferId();
	for (auto &buffer : other.buffers) {
		buffers.insert(make_pair(buffer.first + upper_bound_id, std::move(buffer.second)));
	}
	other.buffers.clear();

	// merge the buffers with free spaces
	for (auto &buffer_id : other.buffers_with_free_space) {
		buffers_with_free_space.insert(buffer_id + upper_bound_id);
	}
	other.buffers_with_free_space.clear();
	NextBufferWithFreeSpace();

	// add the total allocations
	total_segment_count += other.total_segment_count;
}